

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O0

void on_read_connection(uv_stream_t *handle,ssize_t nread,uv_buf_t *buf)

{
  int iVar1;
  uv_handle_type uVar2;
  char *pcVar3;
  uv_loop_t *loop;
  uv_buf_t uVar4;
  uv_pipe_t *local_58;
  char *local_50;
  uv_handle_type pending;
  uv_pipe_t *pipe;
  uv_buf_t outbuf;
  int r;
  uv_buf_t *buf_local;
  ssize_t nread_local;
  uv_stream_t *handle_local;
  
  if (nread == 0) {
    free(buf->base);
  }
  else if (nread < 0) {
    if (nread != -0xfff) {
      pcVar3 = uv_strerror((int)nread);
      printf("error recving on channel: %s\n",pcVar3);
      abort();
    }
    free(buf->base);
  }
  else {
    fprintf(_stderr,"got %d bytes\n",nread & 0xffffffff);
    iVar1 = uv_pipe_pending_count((uv_pipe_t *)handle);
    if (iVar1 != 1) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
              ,0x181,"1 == uv_pipe_pending_count(pipe)");
      abort();
    }
    uVar2 = uv_pipe_pending_type((uv_pipe_t *)handle);
    if (((nread < 1) || (buf->base == (char *)0x0)) || (uVar2 == UV_UNKNOWN_HANDLE)) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
              ,0x184,"nread > 0 && buf->base && pending != UV_UNKNOWN_HANDLE");
      abort();
    }
    read_cb_called = read_cb_called + 1;
    if (uVar2 != UV_TCP) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
              ,0x188,"pending == UV_TCP");
      abort();
    }
    loop = uv_default_loop();
    outbuf.len._4_4_ = uv_tcp_init(loop,&tcp_connection);
    if (outbuf.len._4_4_ != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
              ,0x18a,"r == 0");
      abort();
    }
    outbuf.len._4_4_ = uv_accept(handle,(uv_stream_t *)&tcp_connection);
    if (outbuf.len._4_4_ != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
              ,0x18d,"r == 0");
      abort();
    }
    iVar1 = memcmp("hello\n",buf->base,nread);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
              ,400,"memcmp(\"hello\\n\", buf->base, nread) == 0");
      abort();
    }
    uVar4 = uv_buf_init("world\n",6);
    local_58 = (uv_pipe_t *)uVar4.base;
    pipe = local_58;
    local_50 = (char *)uVar4.len;
    outbuf.base = local_50;
    outbuf.len._4_4_ =
         uv_write(&write_req,(uv_stream_t *)&tcp_connection,(uv_buf_t *)&pipe,1,on_tcp_write);
    if (outbuf.len._4_4_ != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
              ,0x196,"r == 0");
      abort();
    }
    outbuf.len._4_4_ = uv_read_start((uv_stream_t *)&tcp_connection,on_read_alloc,on_tcp_read);
    if (outbuf.len._4_4_ != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
              ,0x199,"r == 0");
      abort();
    }
    free(buf->base);
  }
  return;
}

Assistant:

static void on_read_connection(uv_stream_t* handle,
                               ssize_t nread,
                               const uv_buf_t* buf) {
  int r;
  uv_buf_t outbuf;
  uv_pipe_t* pipe;
  uv_handle_type pending;

  pipe = (uv_pipe_t*) handle;
  if (nread == 0) {
    /* Everything OK, but nothing read. */
    free(buf->base);
    return;
  }

  if (nread < 0) {
    if (nread == UV_EOF) {
      free(buf->base);
      return;
    }

    printf("error recving on channel: %s\n", uv_strerror(nread));
    abort();
  }

  fprintf(stderr, "got %d bytes\n", (int)nread);

  ASSERT(1 == uv_pipe_pending_count(pipe));
  pending = uv_pipe_pending_type(pipe);

  ASSERT(nread > 0 && buf->base && pending != UV_UNKNOWN_HANDLE);
  read_cb_called++;

  /* Accept the pending TCP connection */
  ASSERT(pending == UV_TCP);
  r = uv_tcp_init(uv_default_loop(), &tcp_connection);
  ASSERT(r == 0);

  r = uv_accept(handle, (uv_stream_t*)&tcp_connection);
  ASSERT(r == 0);

  /* Make sure that the expected data is correctly multiplexed. */
  ASSERT(memcmp("hello\n", buf->base, nread) == 0);

  /* Write/read to/from the connection */
  outbuf = uv_buf_init("world\n", 6);
  r = uv_write(&write_req, (uv_stream_t*)&tcp_connection, &outbuf, 1,
    on_tcp_write);
  ASSERT(r == 0);

  r = uv_read_start((uv_stream_t*)&tcp_connection, on_read_alloc, on_tcp_read);
  ASSERT(r == 0);

  free(buf->base);
}